

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.cpp
# Opt level: O1

json_object * __thiscall
json_deserializer::deserialize_json_object
          (json_object *__return_storage_ptr__,json_deserializer *this)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char cVar4;
  ulong uVar5;
  pointer pcVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  json_array jsonArray;
  json_bool jsonBool;
  json_str jsonStr;
  json_str key;
  json_object jsonObject;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_object_*>
  local_118;
  undefined1 local_f0 [17];
  undefined7 uStack_df;
  undefined1 auStack_d8 [8];
  undefined1 local_d0 [16];
  undefined1 local_c0 [32];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
  *local_a0;
  json_str local_98;
  json_object *local_70;
  json_object local_68;
  
  (__return_storage_ptr__->super_json_element)._vptr_json_element =
       (_func_int **)&PTR_get_type_0012da90;
  local_a0 = &__return_storage_ptr__->map;
  p_Var1 = &(__return_storage_ptr__->map)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(__return_storage_ptr__->map)._M_t._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->map)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (__return_storage_ptr__->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_f0 + 0x10);
  paVar3 = &local_118.first.field_2;
  local_70 = __return_storage_ptr__;
  do {
    uVar8 = (long)(this->reader).index + 1;
    if (uVar8 < (this->reader).cbuf._M_string_length) {
      (this->reader).index = (int)uVar8;
    }
    if ((this->reader).cbuf._M_dataplus._M_p[(this->reader).index] == '}') {
      return local_70;
    }
    deserialize_str(&local_98,this);
    uVar5 = (this->reader).cbuf._M_string_length;
    uVar10 = (ulong)(this->reader).index;
    uVar8 = uVar10 + 1;
    if (uVar8 < uVar5) {
      pcVar6 = (this->reader).cbuf._M_dataplus._M_p;
      do {
        iVar9 = (int)uVar8;
        (this->reader).index = iVar9;
        if (pcVar6[iVar9] == ':') {
          iVar9 = (int)uVar10 + 2;
          if ((ulong)(long)iVar9 < uVar5) {
            (this->reader).index = iVar9;
          }
          break;
        }
        uVar10 = uVar8 & 0xffffffff;
        uVar8 = (ulong)(iVar9 + 1U);
      } while ((ulong)(long)(int)(iVar9 + 1U) < uVar5);
    }
    uVar7 = current_deserialization_type(this);
    if ((uVar7 & 2) != 0) {
      deserialize_str((json_str *)local_d0,this);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
                  *)&local_68,&local_a0->_M_t);
      local_f0._0_8_ = paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_f0,local_98.value._M_dataplus._M_p,
                 local_98.value._M_dataplus._M_p + local_98.value._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._0_8_ == paVar2) {
        local_118.first.field_2._8_8_ = auStack_d8;
        local_118.first._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_118.first._M_dataplus._M_p = (pointer)local_f0._0_8_;
      }
      local_118.first.field_2._M_allocated_capacity._1_7_ = uStack_df;
      local_118.first.field_2._M_local_buf[0] = local_f0[0x10];
      local_118.first._M_string_length = local_f0._8_8_;
      local_f0._8_8_ = (pointer)0x0;
      local_f0[0x10] = 0;
      local_118.second = (json_object *)local_d0;
      local_f0._0_8_ = paVar2;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,json_element*>,std::_Select1st<std::pair<std::__cxx11::string_const,json_element*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,json_str*>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,json_element*>,std::_Select1st<std::pair<std::__cxx11::string_const,json_element*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
                  *)&local_68,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_str_*>
                  *)&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118.first._M_dataplus._M_p != paVar3) {
        operator_delete(local_118.first._M_dataplus._M_p,
                        local_118.first.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._0_8_ != paVar2) {
        operator_delete((void *)local_f0._0_8_,CONCAT71(uStack_df,local_f0[0x10]) + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
                   *)&local_68);
      local_d0._0_8_ = &PTR_get_type_0012d990;
      if ((undefined1 *)local_d0._8_8_ != local_c0 + 8) {
        operator_delete((void *)local_d0._8_8_,local_c0._8_8_ + 1);
      }
      goto LAB_001133f2;
    }
    uVar7 = current_deserialization_type(this);
    if ((uVar7 & 1) == 0) {
      uVar7 = current_deserialization_type(this);
      if ((uVar7 & 4) != 0) {
        deserialize_number((json_deserializer *)local_f0);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
        ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
                    *)&local_68,&local_a0->_M_t);
        local_118.first._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_118,local_98.value._M_dataplus._M_p,
                   local_98.value._M_dataplus._M_p + local_98.value._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118.first._M_dataplus._M_p == paVar3) {
          local_c0._8_8_ = local_118.first.field_2._8_8_;
          local_d0._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_c0;
        }
        else {
          local_d0._0_8_ = local_118.first._M_dataplus._M_p;
        }
        local_c0._0_8_ = local_118.first.field_2._M_allocated_capacity;
        local_d0._8_8_ = local_118.first._M_string_length;
        local_118.first._M_string_length = 0;
        local_118.first.field_2._M_allocated_capacity =
             local_118.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_c0._16_8_ = local_f0;
        local_118.first._M_dataplus._M_p = (pointer)paVar3;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,json_element*>,std::_Select1st<std::pair<std::__cxx11::string_const,json_element*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,json_number*>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,json_element*>,std::_Select1st<std::pair<std::__cxx11::string_const,json_element*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
                    *)&local_68,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_number_*>
                    *)local_d0);
        goto LAB_001133bd;
      }
      uVar7 = current_deserialization_type(this);
      if ((uVar7 & 0x10) == 0) {
        uVar7 = current_deserialization_type(this);
        if ((uVar7 & 8) != 0) {
          uVar7 = current_deserialization_type(this);
          if ((uVar7 & 0x40) == 0) {
            uVar7 = current_deserialization_type(this);
            if (-1 < (char)uVar7) goto LAB_001133f2;
            deserialize_bool_false((json_deserializer *)local_f0);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
            ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
                        *)&local_68,&local_a0->_M_t);
            local_118.first._M_dataplus._M_p = (pointer)paVar3;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_118,local_98.value._M_dataplus._M_p,
                       local_98.value._M_dataplus._M_p + local_98.value._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118.first._M_dataplus._M_p == paVar3) {
              local_c0._8_8_ = local_118.first.field_2._8_8_;
              local_d0._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_c0;
            }
            else {
              local_d0._0_8_ = local_118.first._M_dataplus._M_p;
            }
            local_c0._0_8_ = local_118.first.field_2._M_allocated_capacity;
            local_d0._8_8_ = local_118.first._M_string_length;
            local_118.first._M_string_length = 0;
            local_118.first.field_2._M_allocated_capacity =
                 local_118.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_c0._16_8_ = local_f0;
            local_118.first._M_dataplus._M_p = (pointer)paVar3;
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,json_element*>,std::_Select1st<std::pair<std::__cxx11::string_const,json_element*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,json_bool*>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,json_element*>,std::_Select1st<std::pair<std::__cxx11::string_const,json_element*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
                        *)&local_68,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_bool_*>
                        *)local_d0);
          }
          else {
            deserialize_bool_true((json_deserializer *)local_f0);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
            ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
                        *)&local_68,&local_a0->_M_t);
            local_118.first._M_dataplus._M_p = (pointer)paVar3;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_118,local_98.value._M_dataplus._M_p,
                       local_98.value._M_dataplus._M_p + local_98.value._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118.first._M_dataplus._M_p == paVar3) {
              local_c0._8_8_ = local_118.first.field_2._8_8_;
              local_d0._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_c0;
            }
            else {
              local_d0._0_8_ = local_118.first._M_dataplus._M_p;
            }
            local_c0._0_8_ = local_118.first.field_2._M_allocated_capacity;
            local_d0._8_8_ = local_118.first._M_string_length;
            local_118.first._M_string_length = 0;
            local_118.first.field_2._M_allocated_capacity =
                 local_118.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_c0._16_8_ = local_f0;
            local_118.first._M_dataplus._M_p = (pointer)paVar3;
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,json_element*>,std::_Select1st<std::pair<std::__cxx11::string_const,json_element*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,json_bool*>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,json_element*>,std::_Select1st<std::pair<std::__cxx11::string_const,json_element*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
                        *)&local_68,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_bool_*>
                        *)local_d0);
          }
          goto LAB_001133bd;
        }
        uVar7 = current_deserialization_type(this);
        if ((uVar7 & 0x20) != 0) {
          deserialize_json_object(&local_68,this);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
          ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
                      *)local_d0,&local_a0->_M_t);
          local_f0._0_8_ = paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_f0,local_98.value._M_dataplus._M_p,
                     local_98.value._M_dataplus._M_p + local_98.value._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._0_8_ == paVar2) {
            local_118.first.field_2._8_8_ = auStack_d8;
            local_118.first._M_dataplus._M_p = (pointer)paVar3;
          }
          else {
            local_118.first._M_dataplus._M_p = (pointer)local_f0._0_8_;
          }
          local_118.first.field_2._M_allocated_capacity._1_7_ = uStack_df;
          local_118.first.field_2._M_local_buf[0] = local_f0[0x10];
          local_118.first._M_string_length = local_f0._8_8_;
          local_f0._8_8_ = (pointer)0x0;
          local_f0[0x10] = 0;
          local_118.second = &local_68;
          local_f0._0_8_ = paVar2;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,json_element*>,std::_Select1st<std::pair<std::__cxx11::string_const,json_element*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,json_object*>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,json_element*>,std::_Select1st<std::pair<std::__cxx11::string_const,json_element*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
                      *)local_d0,&local_118);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118.first._M_dataplus._M_p != paVar3) {
            operator_delete(local_118.first._M_dataplus._M_p,
                            local_118.first.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._0_8_ != paVar2) {
            operator_delete((void *)local_f0._0_8_,CONCAT71(uStack_df,local_f0[0x10]) + 1);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
                       *)local_d0);
          json_object::~json_object(&local_68);
        }
      }
      else {
        deserialize_array((json_array *)&local_118,this);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
        ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
                    *)&local_68,&local_a0->_M_t);
        local_f0._0_8_ = paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_f0,local_98.value._M_dataplus._M_p,
                   local_98.value._M_dataplus._M_p + local_98.value._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._0_8_ == paVar2) {
          local_c0._8_8_ = auStack_d8;
          local_d0._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_c0;
        }
        else {
          local_d0._0_8_ = local_f0._0_8_;
        }
        local_c0._1_7_ = uStack_df;
        local_c0[0] = local_f0[0x10];
        local_d0._8_8_ = local_f0._8_8_;
        local_f0._8_8_ = (pointer)0x0;
        local_f0[0x10] = 0;
        local_f0._0_8_ = paVar2;
        local_c0._16_8_ = &local_118;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,json_element*>,std::_Select1st<std::pair<std::__cxx11::string_const,json_element*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,json_array*>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,json_element*>,std::_Select1st<std::pair<std::__cxx11::string_const,json_element*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
                    *)&local_68,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_array_*>
                    *)local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0) {
          operator_delete((void *)local_d0._0_8_,local_c0._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._0_8_ != paVar2) {
          operator_delete((void *)local_f0._0_8_,CONCAT71(uStack_df,local_f0[0x10]) + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
                     *)&local_68);
        json_array::~json_array((json_array *)&local_118);
      }
    }
    else {
      deserialize_null((json_deserializer *)local_f0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
                  *)&local_68,&local_a0->_M_t);
      local_118.first._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_118,local_98.value._M_dataplus._M_p,
                 local_98.value._M_dataplus._M_p + local_98.value._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118.first._M_dataplus._M_p == paVar3) {
        local_c0._8_8_ = local_118.first.field_2._8_8_;
        local_d0._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_c0;
      }
      else {
        local_d0._0_8_ = local_118.first._M_dataplus._M_p;
      }
      local_c0._0_8_ = local_118.first.field_2._M_allocated_capacity;
      local_d0._8_8_ = local_118.first._M_string_length;
      local_118.first._M_string_length = 0;
      local_118.first.field_2._M_allocated_capacity =
           local_118.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_c0._16_8_ = local_f0;
      local_118.first._M_dataplus._M_p = (pointer)paVar3;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,json_element*>,std::_Select1st<std::pair<std::__cxx11::string_const,json_element*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,json_null*>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,json_element*>,std::_Select1st<std::pair<std::__cxx11::string_const,json_element*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
                  *)&local_68,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_null_*>
                  *)local_d0);
LAB_001133bd:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0) {
        operator_delete((void *)local_d0._0_8_,local_c0._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118.first._M_dataplus._M_p != paVar3) {
        operator_delete(local_118.first._M_dataplus._M_p,
                        local_118.first.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
                   *)&local_68);
    }
LAB_001133f2:
    uVar8 = (long)(this->reader).index + 1;
    if (uVar8 < (this->reader).cbuf._M_string_length) {
      (this->reader).index = (int)uVar8;
    }
    cVar4 = (this->reader).cbuf._M_dataplus._M_p[(this->reader).index];
    local_98.super_json_element._vptr_json_element = (_func_int **)&PTR_get_type_0012d990;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.value._M_dataplus._M_p != &local_98.value.field_2) {
      operator_delete(local_98.value._M_dataplus._M_p,
                      local_98.value.field_2._M_allocated_capacity + 1);
    }
    if (cVar4 == '}') {
      return local_70;
    }
  } while( true );
}

Assistant:

json_object deserialize_json_object() {
        json_object obj;

        while(true) {
            reader.next();

            if (reader.current() == closing_object) {
                return obj;
            }

            json_str key = deserialize_str();

            while (reader.next()) {
                char current = reader.current();
                if (current == ':') {
                    reader.next();
                    break;
                }
            }

            if ((current_deserialization_type() & g_json_str) != 0) {
                json_str jsonStr = deserialize_str();
                obj.kvmap().insert(make_pair(key.str_value(), &jsonStr));
            } else if ((current_deserialization_type() & g_json_null) != 0) {
                json_null jsonNull = deserialize_null();
                obj.kvmap().insert(make_pair(key.str_value(), &jsonNull));
            } else if ((current_deserialization_type() & g_json_number) != 0) {
                json_number jsonNumber = deserialize_number();
                obj.kvmap().insert(make_pair(key.str_value(), &jsonNumber));
            } else if ((current_deserialization_type() & g_json_array) != 0) {
                json_array jsonArray = deserialize_array();
                obj.kvmap().insert(make_pair(key.str_value(), &jsonArray));
            } else if ((current_deserialization_type() & g_json_bool) != 0) {
                if ((current_deserialization_type() & g_json_true) != 0) {
                    json_bool jsonBool = deserialize_bool_true();
                    obj.kvmap().insert(make_pair(key.str_value(), &jsonBool));
                } else if ((current_deserialization_type() & g_json_false) != 0) {
                    json_bool jsonBool = deserialize_bool_false();
                    obj.kvmap().insert(make_pair(key.str_value(), &jsonBool));
                }
            } else if ((current_deserialization_type() & g_json_object) != 0) {
                json_object jsonObject = deserialize_json_object();
                obj.kvmap().insert(make_pair(key.str_value(), &jsonObject));
            }

            reader.next();

            if (reader.current() == closing_object) {
                break;
            }
        }

        return obj;
    }